

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

string * __thiscall
cfd::core::Privkey::SignBitcoinMessageWithBase64
          (string *__return_storage_ptr__,Privkey *this,string *message)

{
  ByteData *data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  SignBitcoinMessage((ByteData *)&_Stack_28,this,message);
  CryptoUtil::EncodeBase64_abi_cxx11_
            ((string *)__return_storage_ptr__,(CryptoUtil *)&_Stack_28,data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string Privkey::SignBitcoinMessageWithBase64(
    const std::string &message) const {
  return CryptoUtil::EncodeBase64(SignBitcoinMessage(message));
}